

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.c
# Opt level: O3

gs_val_t *
gs_c_fn_terrain_model_add_water_face
          (gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals)

{
  vec_gs_val_t *pvVar1;
  vec_gs_val_t *pvVar2;
  gs_val_t *pgVar3;
  gs_val_t val;
  gs_val_t val_00;
  vec_int_t idx;
  vec_vec2_t uvs;
  golf_geo_face_t face_00;
  int iVar4;
  int iVar5;
  long lVar6;
  golf_geo_face_t *pgVar7;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  vec3 water_dir;
  gs_val_t uv_val;
  gs_val_t sig;
  gs_val_type signature_arg_types [4];
  golf_geo_face_t face;
  undefined1 auVar12 [24];
  undefined1 in_stack_fffffffffffffe38 [108];
  float fVar13;
  char *pcVar14;
  int iVar15;
  char *pcVar16;
  char *pcVar17;
  char *local_138;
  undefined8 uStack_130;
  char *local_128;
  golf_string_t *local_120;
  vec_gs_val_t *local_118;
  undefined8 uStack_110;
  gs_val_t local_108;
  gs_val_t local_f0;
  gs_val_type local_d8 [6];
  undefined1 local_c0 [144];
  
  bVar11 = 0;
  local_d8[0] = GS_VAL_STRING;
  local_d8[1] = GS_VAL_LIST;
  local_d8[2] = GS_VAL_LIST;
  local_d8[3] = GS_VAL_VEC3;
  gs_c_fn_signature(&local_f0,eval,vals,num_vals,local_d8,4);
  if (local_f0.is_return == true) {
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f0.field_2._8_8_;
    __return_storage_ptr__->type = local_f0.type;
    __return_storage_ptr__->is_return = (_Bool)local_f0.is_return;
    *(int3 *)&__return_storage_ptr__->field_0x5 = local_f0._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_f0.field_2.vec2_val;
  }
  else {
    pvVar1 = vals[1].field_2.list_val;
    pvVar2 = vals[2].field_2.list_val;
    if (pvVar1->length == pvVar2->length) {
      local_120 = (vals->field_2).string_val;
      local_118 = vals[3].field_2.list_val;
      uStack_110 = 0;
      fVar13 = *(float *)((long)&vals[3].field_2 + 8);
      local_138 = (char *)0x0;
      uStack_130 = 0;
      local_128 = "geo";
      pcVar14 = (char *)0x0;
      iVar5 = 0;
      iVar15 = 0;
      pcVar16 = "geo";
      if (0 < pvVar1->length) {
        lVar9 = 0;
        lVar10 = 0;
        do {
          val.field_2._8_8_ = *(undefined8 *)((long)&pvVar1->data->field_2 + lVar9 + 8);
          val._0_16_ = *(undefined1 (*) [16])((long)&pvVar1->data->type + lVar9);
          gs_eval_cast((gs_val_t *)local_c0,eval,val,GS_VAL_INT);
          if (local_c0[4] == true) {
            pcVar16 = "Expected an int in idx list";
            goto LAB_0011b124;
          }
          pgVar3 = pvVar2->data;
          val_00.field_2._8_8_ = *(undefined8 *)((long)&pgVar3->field_2 + lVar9 + 8);
          val_00._0_16_ = *(undefined1 (*) [16])((long)&pgVar3->type + lVar9);
          gs_eval_cast(&local_108,eval,val_00,GS_VAL_VEC2);
          if (local_108.is_return != false) {
            pcVar16 = "Expected a vec2 in uv list";
            goto LAB_0011b124;
          }
          iVar4 = vec_expand_(&local_138,(int *)&uStack_130,(int *)((long)&uStack_130 + 4),4,
                              local_128);
          if (iVar4 == 0) {
            lVar6 = (long)(int)uStack_130;
            uStack_130 = CONCAT44(uStack_130._4_4_,(int)uStack_130 + 1);
            *(undefined4 *)(local_138 + lVar6 * 4) = local_c0._8_4_;
          }
          iVar4 = vec_expand_((char **)&stack0xfffffffffffffea8,(int *)&stack0xfffffffffffffeb0,
                              (int *)&stack0xfffffffffffffeb4,8,pcVar16);
          if (iVar4 == 0) {
            lVar6 = (long)iVar5;
            iVar5 = iVar5 + 1;
            *(vec2 *)(pcVar14 + lVar6 * 8) = local_108.field_2.vec2_val;
          }
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 0x18;
        } while (lVar10 < pvVar1->length);
      }
      uvs.capacity = iVar15;
      uvs.length = iVar5;
      idx.length = (int)uStack_130;
      idx.capacity = uStack_130._4_4_;
      idx.data = (int *)local_138;
      idx.alloc_category = local_128;
      uvs.data = (vec2 *)pcVar14;
      uvs.alloc_category = pcVar16;
      water_dir.z = fVar13;
      water_dir._0_8_ = local_118;
      pcVar17 = pcVar16;
      golf_geo_face((golf_geo_face_t *)local_c0,local_120->cstr,idx,GOLF_GEO_FACE_UV_GEN_MANUAL,uvs,
                    water_dir);
      pgVar7 = (golf_geo_face_t *)local_c0;
      puVar8 = (undefined8 *)&stack0xfffffffffffffe08;
      for (lVar9 = 0x12; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar8 = *(undefined8 *)pgVar7;
        pgVar7 = (golf_geo_face_t *)((long)pgVar7 + (ulong)bVar11 * -0x10 + 8);
        puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
      }
      auVar12 = in_stack_fffffffffffffe38._64_24_;
      face_00.material_name[7] = in_stack_fffffffffffffe38[0];
      face_00.material_name[8] = in_stack_fffffffffffffe38[1];
      face_00.material_name[9] = in_stack_fffffffffffffe38[2];
      face_00.material_name[10] = in_stack_fffffffffffffe38[3];
      face_00.material_name[0xb] = in_stack_fffffffffffffe38[4];
      face_00.material_name[0xc] = in_stack_fffffffffffffe38[5];
      face_00.material_name[0xd] = in_stack_fffffffffffffe38[6];
      face_00.material_name[0xe] = in_stack_fffffffffffffe38[7];
      face_00.material_name[0xf] = in_stack_fffffffffffffe38[8];
      face_00.material_name[0x10] = in_stack_fffffffffffffe38[9];
      face_00.material_name[0x11] = in_stack_fffffffffffffe38[10];
      face_00.material_name[0x12] = in_stack_fffffffffffffe38[0xb];
      face_00.material_name[0x13] = in_stack_fffffffffffffe38[0xc];
      face_00.material_name[0x14] = in_stack_fffffffffffffe38[0xd];
      face_00.material_name[0x15] = in_stack_fffffffffffffe38[0xe];
      face_00.material_name[0x16] = in_stack_fffffffffffffe38[0xf];
      face_00.material_name[0x17] = in_stack_fffffffffffffe38[0x10];
      face_00.material_name[0x18] = in_stack_fffffffffffffe38[0x11];
      face_00.material_name[0x19] = in_stack_fffffffffffffe38[0x12];
      face_00.material_name[0x1a] = in_stack_fffffffffffffe38[0x13];
      face_00.material_name[0x1b] = in_stack_fffffffffffffe38[0x14];
      face_00.material_name[0x1c] = in_stack_fffffffffffffe38[0x15];
      face_00.material_name[0x1d] = in_stack_fffffffffffffe38[0x16];
      face_00.material_name[0x1e] = in_stack_fffffffffffffe38[0x17];
      face_00.material_name[0x1f] = in_stack_fffffffffffffe38[0x18];
      face_00.material_name[0x20] = in_stack_fffffffffffffe38[0x19];
      face_00.material_name[0x21] = in_stack_fffffffffffffe38[0x1a];
      face_00.material_name[0x22] = in_stack_fffffffffffffe38[0x1b];
      face_00.material_name[0x23] = in_stack_fffffffffffffe38[0x1c];
      face_00.material_name[0x24] = in_stack_fffffffffffffe38[0x1d];
      face_00.material_name[0x25] = in_stack_fffffffffffffe38[0x1e];
      face_00.material_name[0x26] = in_stack_fffffffffffffe38[0x1f];
      face_00.material_name[0x27] = in_stack_fffffffffffffe38[0x20];
      face_00.material_name[0x28] = in_stack_fffffffffffffe38[0x21];
      face_00.material_name[0x29] = in_stack_fffffffffffffe38[0x22];
      face_00.material_name[0x2a] = in_stack_fffffffffffffe38[0x23];
      face_00.material_name[0x2b] = in_stack_fffffffffffffe38[0x24];
      face_00.material_name[0x2c] = in_stack_fffffffffffffe38[0x25];
      face_00.material_name[0x2d] = in_stack_fffffffffffffe38[0x26];
      face_00.material_name[0x2e] = in_stack_fffffffffffffe38[0x27];
      face_00.material_name[0x2f] = in_stack_fffffffffffffe38[0x28];
      face_00.material_name[0x30] = in_stack_fffffffffffffe38[0x29];
      face_00.material_name[0x31] = in_stack_fffffffffffffe38[0x2a];
      face_00.material_name[0x32] = in_stack_fffffffffffffe38[0x2b];
      face_00.material_name[0x33] = in_stack_fffffffffffffe38[0x2c];
      face_00.material_name[0x34] = in_stack_fffffffffffffe38[0x2d];
      face_00.material_name[0x35] = in_stack_fffffffffffffe38[0x2e];
      face_00.material_name[0x36] = in_stack_fffffffffffffe38[0x2f];
      face_00.material_name[0x37] = in_stack_fffffffffffffe38[0x30];
      face_00.material_name[0x38] = in_stack_fffffffffffffe38[0x31];
      face_00.material_name[0x39] = in_stack_fffffffffffffe38[0x32];
      face_00.material_name[0x3a] = in_stack_fffffffffffffe38[0x33];
      face_00.material_name[0x3b] = in_stack_fffffffffffffe38[0x34];
      face_00.material_name[0x3c] = in_stack_fffffffffffffe38[0x35];
      face_00.material_name[0x3d] = in_stack_fffffffffffffe38[0x36];
      face_00.material_name[0x3e] = in_stack_fffffffffffffe38[0x37];
      face_00.material_name[0x3f] = in_stack_fffffffffffffe38[0x38];
      face_00._65_7_ = in_stack_fffffffffffffe38._57_7_;
      face_00.idx.data = (int *)auVar12._0_8_;
      face_00.idx.length = auVar12._8_4_;
      face_00.idx.capacity = auVar12._12_4_;
      face_00.idx.alloc_category = (char *)auVar12._16_8_;
      face_00.uv_gen_type = in_stack_fffffffffffffe38._88_4_;
      face_00._100_4_ = in_stack_fffffffffffffe38._92_4_;
      face_00.uvs.data = (vec2 *)in_stack_fffffffffffffe38._96_8_;
      face_00.uvs.length = in_stack_fffffffffffffe38._104_4_;
      face_00._0_8_ = pcVar16;
      face_00.uvs.capacity = (int)fVar13;
      face_00.uvs.alloc_category = pcVar14;
      face_00.start_vertex_in_model = iVar5;
      face_00.water_dir.x = (float)iVar15;
      face_00.water_dir._4_8_ = pcVar17;
      golf_editor_edit_mode_geo_add_face(face_00);
      gs_val_void();
    }
    else {
      pcVar16 = "Need same number of idx and uvs";
LAB_0011b124:
      gs_val_error(__return_storage_ptr__,pcVar16);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_c_fn_terrain_model_add_water_face(gs_eval_t *eval, gs_val_t *vals, int num_vals) {
    gs_val_type signature_arg_types[] = { GS_VAL_STRING, GS_VAL_LIST, GS_VAL_LIST, GS_VAL_VEC3 };
    int signature_arg_count = sizeof(signature_arg_types) / sizeof(signature_arg_types[0]);
    gs_val_t sig = gs_c_fn_signature(eval, vals, num_vals, signature_arg_types, signature_arg_count);
    if (sig.is_return) return sig;

    golf_string_t *material_string = vals[0].string_val;
    vec_gs_val_t *idx_list = vals[1].list_val;
    vec_gs_val_t *uvs_list = vals[2].list_val;
    vec3 water_dir = vals[3].vec3_val;

    if (idx_list->length != uvs_list->length) {
        return gs_val_error("Need same number of idx and uvs");
    }
    
    vec_int_t idx;
    vec_init(&idx, "geo");

    vec_vec2_t uvs;
    vec_init(&uvs, "geo");

    for (int i = 0; i < idx_list->length; i++) {
        gs_val_t idx_val = gs_eval_cast(eval, idx_list->data[i], GS_VAL_INT);
        if (idx_val.is_return) {
            return gs_val_error("Expected an int in idx list");
        }

        gs_val_t uv_val = gs_eval_cast(eval, uvs_list->data[i], GS_VAL_VEC2);
        if (uv_val.is_return) {
            return gs_val_error("Expected a vec2 in uv list");
        }

        vec_push(&idx, idx_val.int_val);
        vec_push(&uvs, uv_val.vec2_val);
    }

    golf_geo_face_t face = golf_geo_face(material_string->cstr, idx, GOLF_GEO_FACE_UV_GEN_MANUAL, uvs, water_dir);
    golf_editor_edit_mode_geo_add_face(face);

    return gs_val_void();
}